

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O2

int P_Thing_Damage(int tid,AActor *whofor0,int amount,FName *type)

{
  int iVar1;
  int iVar2;
  AActor *this;
  int iVar3;
  DAngle in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  FActorIterator iterator;
  FName local_5c;
  AActor *local_58;
  FName *local_50;
  undefined8 local_48;
  FActorIterator local_40;
  
  local_40.base = (AActor *)0x0;
  local_58 = whofor0;
  local_50 = type;
  local_40.id = tid;
  if (tid != 0) {
    whofor0 = FActorIterator::Next(&local_40);
    in_XMM0_Qa.Degrees = extraout_XMM0_Qa;
  }
  iVar3 = 0;
  while (this = whofor0, this != (AActor *)0x0) {
    if (tid == 0) {
      whofor0 = (AActor *)0x0;
    }
    else {
      whofor0 = FActorIterator::Next(&local_40);
      in_XMM0_Qa.Degrees = extraout_XMM0_Qa_00;
    }
    if (((this->flags).Value & 4) != 0) {
      if (amount < 1) {
        iVar2 = this->health;
        iVar1 = AActor::SpawnHealth(this);
        in_XMM0_Qa.Degrees = extraout_XMM0_Qa_02;
        if (iVar2 < iVar1) {
          iVar2 = this->health - amount;
          this->health = iVar2;
          iVar1 = AActor::SpawnHealth(this);
          in_XMM0_Qa.Degrees = extraout_XMM0_Qa_03;
          if (iVar1 < iVar2) {
            iVar2 = AActor::SpawnHealth(this);
            this->health = iVar2;
            in_XMM0_Qa.Degrees = extraout_XMM0_Qa_04;
          }
          if (this->player != (player_t *)0x0) {
            this->player->health = this->health;
          }
        }
      }
      else {
        local_5c.Index = local_50->Index;
        local_48 = 0;
        P_DamageMobj(this,(AActor *)0x0,local_58,amount,&local_5c,0,in_XMM0_Qa);
        in_XMM0_Qa.Degrees = extraout_XMM0_Qa_01;
      }
      iVar3 = iVar3 + 1;
    }
  }
  return iVar3;
}

Assistant:

int P_Thing_Damage (int tid, AActor *whofor0, int amount, FName type)
{
	FActorIterator iterator (tid);
	int count = 0;
	AActor *actor;

	actor = (tid == 0 ? whofor0 : iterator.Next());
	while (actor)
	{
		AActor *next = tid == 0 ? NULL : iterator.Next ();
		if (actor->flags & MF_SHOOTABLE)
		{
			if (amount > 0)
			{
				P_DamageMobj (actor, NULL, whofor0, amount, type);
			}
			else if (actor->health < actor->SpawnHealth())
			{
				actor->health -= amount;
				if (actor->health > actor->SpawnHealth())
				{
					actor->health = actor->SpawnHealth();
				}
				if (actor->player != NULL)
				{
					actor->player->health = actor->health;
				}
			}
			count++;
		}
		actor = next;
	}
	return count;
}